

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

void anm_replace(anm_archive_t *anm,FILE *anmfp,anm_entry_t *entry_first,char *filename,int version)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  anm_entry_t *paVar4;
  thtx_header_t *ptVar5;
  uchar *puVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  image_t *image;
  uchar *puVar15;
  anm_entry_t *paVar16;
  long lVar17;
  format_t format;
  long lVar18;
  list_node_t *plVar19;
  uint32_t uVar20;
  uint8_t *png;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  uint32_t local_bc;
  size_t size;
  uint height;
  uint width;
  image_t local_48;
  undefined1 auVar25 [16];
  
  width = 0;
  height = 0;
  util_total_entry_size(entry_first,&width,&height);
  uVar7 = width;
  uVar3 = height;
  uVar14 = (ulong)width;
  uVar22 = (ulong)height;
  if (height != 0 && width != 0) {
    if (version == 0x13) {
      if (option_dont_add_offset_border == 0) {
        bVar23 = entry_first->header->y != 0 || entry_first->header->x != 0;
      }
      else {
        bVar23 = false;
      }
      png = entry_first->data;
      uVar20 = entry_first->thtx->size;
      iVar8 = png_identify(png,uVar20);
      if ((iVar8 == 0) || ((!bVar23 && (entry_first->next_by_name == (anm_entry_t *)0x0)))) {
        if (1 < option_verbose) {
          fprintf(_stderr,"%s: not composing %s\n",argv0,filename);
        }
        if (!bVar23) {
          paVar16 = entry_first->next_by_name;
          if (paVar16 == (anm_entry_t *)0x0) {
            return;
          }
          if (((paVar16->next_by_name == (anm_entry_t *)0x0) &&
              (uVar3 = entry_first->thtx->size, uVar3 == paVar16->thtx->size)) &&
             (iVar8 = bcmp(entry_first->data,paVar16->data,(ulong)uVar3), iVar8 == 0)) {
            return;
          }
        }
        fprintf(_stderr,"%s: warning: %s can\'t be composed because it\'s a JPEG\n",argv0,filename);
        return;
      }
      if (1 < option_verbose) {
        fprintf(_stderr,"%s: composing %s\n",argv0,filename);
        png = entry_first->data;
        uVar20 = entry_first->thtx->size;
      }
      image = (image_t *)malloc(0x18);
      png_read_mem(image,png,(ulong)uVar20);
    }
    else {
      image = png_read(filename);
    }
    if ((image->width < uVar7) || (image->height < uVar3)) {
      fprintf(_stderr,"%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",argv0,
              current_input,entry_first->name,filename,(ulong)image->width,(ulong)image->height,
              uVar14,uVar22);
LAB_0010d63f:
      exit(1);
    }
    for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
      lVar18 = 0;
      paVar16 = entry_first;
      plVar19 = (list_node_t *)&anm->entries;
      while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
        paVar4 = (anm_entry_t *)plVar19->data;
        if (paVar4 == paVar16) {
          ptVar5 = paVar4->thtx;
          format = (format_t)ptVar5->format;
          if (((&DAT_00135420)[lVar17] == (uint)ptVar5->format) && (paVar4->header->hasdata != 0)) {
            if (version == 0x13) {
              if (lVar17 != 1) {
                fprintf(_stderr,"%s: %s is not FORMAT_BGRA8888\n",argv0,paVar4->name);
                goto LAB_0010d63f;
              }
              ptVar5->size = (uint)ptVar5->h * (uint)ptVar5->w * 4;
              free(paVar4->data);
              puVar15 = (uchar *)malloc((ulong)paVar4->thtx->size);
              paVar4->data = puVar15;
              format = 0xffffffff;
            }
            puVar15 = format_from_rgba((uint32_t *)image->data,uVar3 * uVar7,format);
            local_bc = 0;
            uVar20 = 0;
            if (option_dont_add_offset_border == 0) {
              local_bc = paVar4->header->x;
              uVar20 = paVar4->header->y;
            }
            if (anmfp == (FILE *)0x0) {
              iVar8 = uVar7 * uVar20;
              for (iVar21 = 0; uVar20 + iVar21 < paVar4->thtx->h + uVar20; iVar21 = iVar21 + 1) {
                puVar6 = paVar4->data;
                uVar1 = paVar4->thtx->w;
                uVar11 = format_Bpp(format);
                uVar9 = format_Bpp(format);
                uVar12 = format_Bpp(format);
                uVar2 = paVar4->thtx->w;
                uVar13 = format_Bpp(format);
                memcpy(puVar6 + (uint)uVar1 * uVar11 * iVar21,
                       puVar15 + (ulong)(uVar12 * local_bc) + (ulong)(uVar9 * iVar8),
                       (ulong)(uVar2 * uVar13));
                iVar8 = iVar8 + uVar7;
              }
            }
            else {
              iVar8 = uVar7 * uVar20;
              iVar21 = 0;
              while (uVar20 + iVar21 < paVar4->thtx->h + uVar20) {
                uVar11 = paVar4->header->thtxoffset;
                uVar1 = paVar4->thtx->w;
                uVar9 = format_Bpp(format);
                iVar10 = file_seek(anmfp,(ulong)((uint)uVar1 * uVar9 * iVar21) +
                                         (ulong)uVar11 + lVar18 + 0x10);
                if (iVar10 == 0) goto LAB_0010d63f;
                uVar11 = format_Bpp(format);
                uVar9 = format_Bpp(format);
                uVar1 = paVar4->thtx->w;
                uVar12 = format_Bpp(format);
                iVar10 = file_write(anmfp,puVar15 + (ulong)(uVar9 * local_bc) +
                                                    (ulong)(uVar11 * iVar8),(ulong)(uVar1 * uVar12))
                ;
                iVar21 = iVar21 + 1;
                iVar8 = iVar8 + uVar7;
                if (iVar10 == 0) goto LAB_0010d63f;
              }
            }
            free(puVar15);
            if (version == 0x13) {
              local_48.data = paVar4->data;
              uVar11._0_2_ = paVar4->thtx->w;
              uVar11._2_2_ = paVar4->thtx->h;
              auVar25._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
              auVar25._4_2_ = uVar11._2_2_;
              auVar25._0_4_ = uVar11;
              auVar24._4_12_ = auVar25._4_12_;
              auVar24._0_4_ = uVar11 & 0xffff;
              local_48._8_8_ = auVar24._0_8_;
              local_48.format = 0xffffffff;
              puVar15 = (uchar *)png_write_mem(&local_48,&size);
              paVar4->data = puVar15;
              paVar4->thtx->size = (uint32_t)size;
              free(local_48.data);
            }
            paVar4->processed = 1;
          }
          paVar16 = paVar4->next_by_name;
        }
        lVar18 = lVar18 + (ulong)paVar4->header->nextoffset;
      }
    }
    free(image->data);
    free(image);
  }
  return;
}

Assistant:

static void
anm_replace(
    anm_archive_t* anm,
    FILE* anmfp,
    anm_entry_t* entry_first,
    const char* filename,
    int version)
{
    const format_t formats[] = {
        FORMAT_RGBA8888,
        FORMAT_BGRA8888,
        FORMAT_RGB565,
        FORMAT_ARGB4444,
        FORMAT_GRAY8
    };
    unsigned int f;
    unsigned int width = 0;
    unsigned int height = 0;
    image_t* image;

    util_total_entry_size(entry_first, &width, &height);
    if (width == 0 || height == 0) {
        /* There's nothing to do. */
        return;
    }

    int is_png = 0;
    /* NEWHU: 19 */
    if (version == 19) {
        anm_entry_t *entry = entry_first;
        const uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
        const uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;
        if (!(png_identify(entry->data, entry->thtx->size) && (ox || oy || entry->next_by_name))) {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: not composing %s\n", argv0, filename);
            /* TH19's ability/dummy.png is used twice, but it's the same texture.
             * Avoid printing a warning in this particular case. */
            if (ox || oy || entry->next_by_name && (entry->next_by_name->next_by_name ||
                    entry->thtx->size != entry->next_by_name->thtx->size ||
                    memcmp(entry->data, entry->next_by_name->data, entry->thtx->size))) {
                fprintf(stderr, "%s: warning: %s can't be composed because it's a JPEG\n", argv0, filename);
            }
            return;
        }
        if (option_verbose >= 2)
            fprintf(stderr, "%s: composing %s\n", argv0, filename);
        image = malloc(sizeof(image_t));
        png_read_mem(image, entry->data, entry->thtx->size);
        is_png = 1;
    } else {
        image = png_read(filename);
    }

    if (width > image->width || height > image->height) {
        fprintf(stderr,
            "%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",
            argv0, current_input, entry_first->name, filename, image->width, image->height,
            width, height);
        exit(1);
    }

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
        long offset = 0;
        anm_entry_t *entry, *entry_next = entry_first;
        list_for_each(&anm->entries, entry) {
            if (entry == entry_next &&
                entry->thtx->format == formats[f] &&
                entry->header->hasdata) {
                unsigned int y;
                format_t fmt = formats[f];

                if (is_png) {
                    if (fmt != FORMAT_BGRA8888) {
                        fprintf(stderr, "%s: %s is not FORMAT_BGRA8888\n", argv0, entry->name);
                        exit(1);
                    }
                    fmt = FORMAT_RGBA8888;
                    entry->thtx->size = entry->thtx->w*entry->thtx->h*4;
                    free(entry->data);
                    entry->data = malloc(entry->thtx->size);
                }

                unsigned char* converted_data = format_from_rgba((uint32_t*)image->data, width * height, fmt);
                const uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
                const uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;

                if (anmfp) {
                    for (y = oy; y < oy + entry->thtx->h; ++y) {
                        if (!file_seek(anmfp,
                            offset + entry->header->thtxoffset + sizeof(thtx_header_t) + (y - oy) * entry->thtx->w * format_Bpp(fmt)))
                            exit(1);
                        if (!file_write(anmfp, converted_data + y * width * format_Bpp(fmt) + ox * format_Bpp(fmt), entry->thtx->w * format_Bpp(fmt)))
                            exit(1);
                    }
                } else {
                    for (y = oy; y < oy + entry->thtx->h; ++y) {
                        memcpy(entry->data + (y - oy) * entry->thtx->w * format_Bpp(fmt),
                               converted_data + y * width * format_Bpp(fmt) + ox * format_Bpp(fmt),
                               entry->thtx->w * format_Bpp(fmt));
                    }
                }

                free(converted_data);

                if (is_png) {
                    image_t image2 = {
                        .data = entry->data,
                        .width = entry->thtx->w,
                        .height = entry->thtx->h,
                        .format = FORMAT_RGBA8888,
                    };
                    size_t size;
                    entry->data = png_write_mem(&image2, &size);
                    entry->thtx->size = size;
                    free(image2.data);
                }

                entry->processed = 1;
            }
            if (entry == entry_next)
                entry_next = entry->next_by_name;

            offset += entry->header->nextoffset;
        }
    }

    free(image->data);
    free(image);
}